

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

int fmt::v11::detail::parse_nonnegative_int<char>(char **begin,char *end,int error_value)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  byte *pbVar7;
  
  pbVar2 = (byte *)*begin;
  if ((pbVar2 == (byte *)end) || (bVar1 = *pbVar2, 9 < (byte)(bVar1 - 0x30))) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O2/_deps/fmt-src/include/fmt/base.h"
                ,0x513,"");
  }
  uVar4 = 0;
  pbVar7 = pbVar2;
  do {
    pbVar3 = pbVar7;
    pbVar7 = pbVar3 + 1;
    uVar6 = (ulong)uVar4;
    uVar4 = (uVar4 * 10 + (uint)bVar1) - 0x30;
    pbVar5 = (byte *)end;
    if (pbVar7 == (byte *)end) break;
    bVar1 = *pbVar7;
    pbVar5 = pbVar7;
  } while ((byte)(bVar1 - 0x30) < 10);
  *begin = (char *)pbVar5;
  if ((9 < (long)pbVar5 - (long)pbVar2) &&
     (((long)pbVar5 - (long)pbVar2 != 10 ||
      (((ulong)((int)(char)*pbVar3 - 0x30U & 0xfffffffe) + uVar6 * 10 & 0xffffffff80000000) != 0))))
  {
    uVar4 = error_value;
  }
  return uVar4;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  int digits10 = static_cast<int>(sizeof(int) * CHAR_BIT * 3 / 10);
  if (num_digits <= digits10) return static_cast<int>(value);
  // Check for overflow.
  unsigned max = INT_MAX;
  return num_digits == digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}